

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O1

void __thiscall CTcDataStream::write_obj_id(CTcDataStream *this,ulong obj_id)

{
  ulong uVar1;
  CTcIdFixup *pCVar2;
  CTcIdFixup **in_RCX;
  uint32_t tmp;
  char buf [4];
  undefined4 local_1c;
  
  if ((obj_id != 0) && (G_keep_objfixups != 0)) {
    uVar1 = this->ofs_;
    pCVar2 = (CTcIdFixup *)CTcPrsMem::alloc(G_prsmem,0x20);
    pCVar2->ds_ = this;
    pCVar2->ofs_ = uVar1;
    pCVar2->id_ = obj_id;
    pCVar2->nxt_ = (CTcIdFixup *)0x0;
    in_RCX = &G_objfixup;
    pCVar2->nxt_ = G_objfixup;
    G_objfixup = pCVar2;
  }
  local_1c = (undefined4)obj_id;
  write(this,(int)&local_1c,(void *)0x4,(size_t)in_RCX);
  return;
}

Assistant:

void CTcDataStream::write_obj_id(ulong obj_id)
{
    /* 
     *   if there's an object ID fixup list, and this is a valid object
     *   reference (not a 'nil' reference), add this reference 
     */
    if (G_keep_objfixups && obj_id != TCTARG_INVALID_OBJ)
        CTcIdFixup::add_fixup(&G_objfixup, this, get_ofs(), obj_id);

    /* write the ID */
    write4(obj_id);
}